

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_test.cpp
# Opt level: O0

void __thiscall
TimedMutexTest_TryLockFor_Test<yamc::fair::basic_shared_timed_mutex<yamc::rwlock::PhaseFairness>_>::
~TimedMutexTest_TryLockFor_Test
          (TimedMutexTest_TryLockFor_Test<yamc::fair::basic_shared_timed_mutex<yamc::rwlock::PhaseFairness>_>
           *this)

{
  TimedMutexTest_TryLockFor_Test<yamc::fair::basic_shared_timed_mutex<yamc::rwlock::PhaseFairness>_>
  *this_local;
  
  ~TimedMutexTest_TryLockFor_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TYPED_TEST(TimedMutexTest, TryLockFor)
{
  TypeParam mtx;
  std::size_t counter = 0;
  yamc::test::task_runner(
    TEST_THREADS,
    [&](std::size_t /*id*/) {
      for (std::size_t n = 0; n < TEST_ITERATION; ++n) {
        while (!mtx.try_lock_for(TEST_NOT_TIMEOUT)) {
          std::this_thread::yield();
        }
        std::lock_guard<TypeParam> lk(mtx, std::adopt_lock);
        counter = counter + 1;
      }
    });
  EXPECT_EQ(TEST_ITERATION * TEST_THREADS, counter);
}